

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

StaticAssertion * __thiscall
soul::PoolAllocator::
allocate<soul::AST::StaticAssertion,soul::AST::Context_const&,soul::pool_ref<soul::AST::Expression>&,std::__cxx11::string>
          (PoolAllocator *this,Context *args,pool_ref<soul::AST::Expression> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  Expression *failureCondition;
  PoolItem *pPVar1;
  string local_50;
  
  pPVar1 = allocateSpaceForObject(this,0x58);
  failureCondition = args_1->object;
  std::__cxx11::string::string((string *)&local_50,(string *)args_2);
  AST::StaticAssertion::StaticAssertion
            ((StaticAssertion *)&pPVar1->item,args,failureCondition,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pPVar1->destructor =
       allocate<soul::AST::StaticAssertion,_const_soul::AST::Context_&,_soul::pool_ref<soul::AST::Expression>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::anon_class_1_0_00000001::__invoke;
  return (StaticAssertion *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }